

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O2

void pztopology::TPZTetrahedron::ComputeHDivDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  int i_2;
  int i;
  long lVar5;
  TPZManVector<double,_3> v1;
  TPZManVector<double,_3> v3;
  TPZManVector<double,_3> v2;
  
  dVar3 = TPZAxesTools<double>::ComputeDetjac(gradx);
  TPZManVector<double,_3>::TPZManVector(&v1,3);
  TPZManVector<double,_3>::TPZManVector(&v2,3);
  TPZManVector<double,_3>::TPZManVector(&v3,3);
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    pdVar4 = TPZFMatrix<double>::operator()(gradx,lVar5,0);
    v1.super_TPZVec<double>.fStore[lVar5] = *pdVar4 * 6.0;
    pdVar4 = TPZFMatrix<double>::operator()(gradx,lVar5,1);
    v2.super_TPZVec<double>.fStore[lVar5] = *pdVar4 * 6.0;
    pdVar4 = TPZFMatrix<double>::operator()(gradx,lVar5,2);
    v3.super_TPZVec<double>.fStore[lVar5] = *pdVar4 * 6.0;
  }
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    v1.super_TPZVec<double>.fStore[lVar5] = v1.super_TPZVec<double>.fStore[lVar5] / dVar3;
    v2.super_TPZVec<double>.fStore[lVar5] = v2.super_TPZVec<double>.fStore[lVar5] / dVar3;
    v3.super_TPZVec<double>.fStore[lVar5] = v3.super_TPZVec<double>.fStore[lVar5] / dVar3;
  }
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    dVar3 = v3.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0);
    *pdVar4 = -dVar3;
    dVar3 = v1.super_TPZVec<double>.fStore[lVar5];
    dVar1 = v3.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,1);
    *pdVar4 = dVar3 - dVar1;
    dVar3 = v2.super_TPZVec<double>.fStore[lVar5];
    dVar1 = v3.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,2);
    *pdVar4 = dVar3 - dVar1;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,1);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,3);
    *pdVar4 = (dVar3 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,1);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,2);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,4);
    *pdVar4 = (dVar3 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,2);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,5);
    *pdVar4 = (dVar3 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,3);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,4);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,5);
    dVar2 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,6);
    *pdVar4 = (dVar3 + dVar1 + dVar2) / 3.0;
    dVar3 = v2.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,7);
    *pdVar4 = -dVar3;
    dVar3 = v1.super_TPZVec<double>.fStore[lVar5];
    dVar1 = v2.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,8);
    *pdVar4 = dVar3 - dVar1;
    dVar3 = v3.super_TPZVec<double>.fStore[lVar5];
    dVar1 = v2.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,9);
    *pdVar4 = dVar3 - dVar1;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,7);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,8);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,10);
    *pdVar4 = (dVar3 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,8);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,9);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0xb);
    *pdVar4 = (dVar3 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,7);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,9);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0xc);
    *pdVar4 = (dVar3 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,10);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0xb);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0xc);
    dVar2 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0xd);
    *pdVar4 = (dVar3 + dVar1 + dVar2) / 3.0;
    dVar3 = v1.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0xe);
    *pdVar4 = dVar3;
    dVar3 = v2.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0xf);
    *pdVar4 = dVar3;
    dVar3 = v3.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x10);
    *pdVar4 = dVar3;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0xe);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0xf);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x11);
    *pdVar4 = (dVar3 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0xf);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x10);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x12);
    *pdVar4 = (dVar3 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0xe);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x10);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x13);
    *pdVar4 = (dVar3 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x11);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x12);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x13);
    dVar2 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x14);
    *pdVar4 = (dVar3 + dVar1 + dVar2) / 3.0;
    dVar3 = v1.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x15);
    *pdVar4 = -dVar3;
    dVar3 = v2.super_TPZVec<double>.fStore[lVar5];
    dVar1 = v1.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x16);
    *pdVar4 = dVar3 - dVar1;
    dVar3 = v3.super_TPZVec<double>.fStore[lVar5];
    dVar1 = v1.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x17);
    *pdVar4 = dVar3 - dVar1;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x15);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x16);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x18);
    *pdVar4 = (dVar3 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x16);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x17);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x19);
    *pdVar4 = (dVar3 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x15);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x17);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x1a);
    *pdVar4 = (dVar3 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x18);
    dVar3 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x19);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x1a);
    dVar2 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x1b);
    *pdVar4 = (dVar3 + dVar1 + dVar2) / 3.0;
    dVar3 = v1.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x1c);
    *pdVar4 = dVar3;
    dVar3 = v2.super_TPZVec<double>.fStore[lVar5];
    dVar1 = v1.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x1d);
    *pdVar4 = dVar3 - dVar1;
    dVar3 = v2.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x1e);
    *pdVar4 = -dVar3;
    dVar3 = v3.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x1f);
    *pdVar4 = dVar3;
    dVar3 = v3.super_TPZVec<double>.fStore[lVar5];
    dVar1 = v1.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x20);
    *pdVar4 = dVar3 - dVar1;
    dVar3 = v3.super_TPZVec<double>.fStore[lVar5];
    dVar1 = v2.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x21);
    *pdVar4 = dVar3 - dVar1;
    dVar3 = v1.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x22);
    *pdVar4 = dVar3;
    dVar3 = v2.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x23);
    *pdVar4 = dVar3;
    dVar3 = v1.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x24);
    *pdVar4 = dVar3;
    dVar3 = v3.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x25);
    *pdVar4 = dVar3;
    dVar3 = v2.super_TPZVec<double>.fStore[lVar5];
    dVar1 = v1.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x26);
    *pdVar4 = dVar3 - dVar1;
    dVar3 = v3.super_TPZVec<double>.fStore[lVar5];
    dVar1 = v1.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x27);
    *pdVar4 = dVar3 - dVar1;
    dVar3 = v2.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x28);
    *pdVar4 = dVar3;
    dVar3 = v3.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x29);
    *pdVar4 = dVar3;
    dVar3 = v1.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x2a);
    *pdVar4 = dVar3;
    dVar3 = v2.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x2b);
    *pdVar4 = dVar3;
    dVar3 = v3.super_TPZVec<double>.fStore[lVar5];
    pdVar4 = TPZFMatrix<double>::operator()(directions,lVar5,0x2c);
    *pdVar4 = dVar3;
  }
  TPZManVector<double,_3>::~TPZManVector(&v3);
  TPZManVector<double,_3>::~TPZManVector(&v2);
  TPZManVector<double,_3>::~TPZManVector(&v1);
  return;
}

Assistant:

void TPZTetrahedron::ComputeHDivDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions)
    {
        TVar detjac = TPZAxesTools<TVar>::ComputeDetjac(gradx);
        
        TPZManVector<TVar,3> v1(3),v2(3),v3(3);
        
        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0)*6.;
            v2[i] = gradx(i,1)*6.;
            v3[i] = gradx(i,2)*6.;
        }
        
        
        /**
         * @file
         * @brief Computing mapped vector with scaling factor equal 1.0.
         * using contravariant piola mapping.
         */
        
        {
            // the above constants are wrong
            for (int i=0; i<3; i++) {
                v1[i] /= detjac;
                v2[i] /= detjac;
                v3[i] /= detjac;
            }
            for (int i=0; i<3; i++)
            {
                
                //face 0
                directions(i,0) = -v3[i];
                directions(i,1) = (v1[i]-v3[i]);
                directions(i,2) = (v2[i]-v3[i]);
                directions(i,3) = (directions(i,0)+directions(i,1))/2.;
                directions(i,4) = (directions(i,1)+directions(i,2))/2.;
                directions(i,5) = (directions(i,0)+directions(i,2))/2.;
                directions(i,6) = (directions(i,3)+directions(i,4)+directions(i,5))/3.;
                //face 1
                directions(i,7) = -v2[i];
                directions(i,8) = (v1[i]-v2[i]);
                directions(i,9) = (v3[i]-v2[i]);
                directions(i,10) = (directions(i,7)+directions(i,8))/2.;
                directions(i,11) = (directions(i,8)+directions(i,9))/2.;
                directions(i,12) = (directions(i,7)+directions(i,9))/2.;
                directions(i,13) = (directions(i,10)+directions(i,11)+directions(i,12))/3.;
                //face 2 face diagonal
                
                directions(i,14) = v1[i];
                directions(i,15) = v2[i];
                directions(i,16) = v3[i];
                directions(i,17) = (directions(i,14)+directions(i,15))/2.;
                directions(i,18) = (directions(i,15)+directions(i,16))/2.;
                directions(i,19) = (directions(i,14)+directions(i,16))/2.;
                directions(i,20) = (directions(i,17)+directions(i,18)+directions(i,19))/3.;
                //face 3
                directions(i,21) = -v1[i];
                directions(i,22) = (v2[i]-v1[i]);
                directions(i,23) = (v3[i]-v1[i]);
                directions(i,24) = (directions(i,21)+directions(i,22))/2.;
                directions(i,25) = (directions(i,22)+directions(i,23))/2.;
                directions(i,26) = (directions(i,21)+directions(i,23))/2.;
                directions(i,27) = (directions(i,24)+directions(i,25)+directions(i,26))/3.;
                
                //arestas
                directions(i,28) = v1[i];
                directions(i,29) = (v2[i]-v1[i]);
                directions(i,30) = -v2[i];
                directions(i,31) = v3[i];
                directions(i,32) = (v3[i]-v1[i]);
                directions(i,33) = (v3[i]-v2[i]);
                
                //faces
                directions(i,34) = v1[i];
                directions(i,35) = v2[i];
                directions(i,36) = v1[i];
                directions(i,37) = v3[i];
                directions(i,38) = (v2[i]-v1[i]);
                directions(i,39) = (v3[i]-v1[i]);//v3[i]-0.5*(v1[i]+v2[i]);//
                directions(i,40) = v2[i];
                directions(i,41) = v3[i];
                
                directions(i,42) = v1[i];
                directions(i,43) = v2[i];
                directions(i,44) = v3[i];
                
            }        

        } 

    }